

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.cpp
# Opt level: O2

int __thiscall libDAI::TRW::init(TRW *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  int extraout_EAX;
  Exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  iVar1 = (*(this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((char)iVar1 != '\0') {
    init_messages(this);
    init_rho_e(this);
    return extraout_EAX;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"trw.cpp, line 158",&local_39);
  Exception::Exception(this_00,8,&local_38);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void TRW::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);
        init_messages();
        init_rho_e();
    }